

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FusionEKF.cpp
# Opt level: O3

void __thiscall FusionEKF::FusionEKF(FusionEKF *this)

{
  Matrix<double,__1,__1,_0,__1,__1> *pMVar1;
  DenseIndex DVar2;
  DenseIndex DVar3;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar4;
  long lVar5;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_c8;
  Scalar local_a8;
  Scalar local_a0;
  Scalar local_98;
  Scalar local_90;
  Scalar local_88;
  Scalar local_80;
  Scalar local_78;
  Scalar local_70;
  Scalar local_68;
  Scalar local_60;
  Scalar local_58;
  Scalar local_50;
  Scalar local_48;
  Scalar local_40;
  Scalar local_38;
  
  this->_vptr_FusionEKF = (_func_int **)&PTR__FusionEKF_0011dce8;
  KalmanFilter::KalmanFilter(&this->ekf_);
  Tools::Tools(&this->tools);
  this->is_initialized_ = false;
  this->previous_timestamp_ = 0;
  (this->R_laser_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = (double *)0x0;
  (this->R_laser_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = 0;
  (this->R_laser_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
       = 0;
  (this->R_radar_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = (double *)0x0;
  (this->R_radar_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = 0;
  (this->R_radar_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
       = 0;
  (this->H_laser_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = (double *)0x0;
  (this->H_laser_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = 0;
  (this->H_laser_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
       = 0;
  (this->Hj_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Hj_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->Hj_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  local_c8.m_col = 0;
  local_c8.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)0x0;
  local_c8.m_row = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)&local_c8,4,2,2);
  pMVar1 = (Matrix<double,__1,__1,_0,__1,__1> *)
           (this->R_laser_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data;
  (this->R_laser_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = (double *)local_c8.m_xpr;
  DVar2 = (this->R_laser_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_rows;
  DVar3 = (this->R_laser_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols;
  (this->R_laser_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = local_c8.m_row;
  (this->R_laser_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
       = local_c8.m_col;
  local_c8.m_xpr = pMVar1;
  local_c8.m_row = DVar2;
  local_c8.m_col = DVar3;
  free(pMVar1);
  local_c8.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)0x0;
  local_c8.m_row = 0;
  local_c8.m_col = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)&local_c8,9,3,3);
  pMVar1 = (Matrix<double,__1,__1,_0,__1,__1> *)
           (this->R_radar_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data;
  (this->R_radar_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = (double *)local_c8.m_xpr;
  DVar2 = (this->R_radar_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_rows;
  DVar3 = (this->R_radar_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols;
  (this->R_radar_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = local_c8.m_row;
  (this->R_radar_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
       = local_c8.m_col;
  local_c8.m_xpr = pMVar1;
  local_c8.m_row = DVar2;
  local_c8.m_col = DVar3;
  free(pMVar1);
  local_c8.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)0x0;
  local_c8.m_row = 0;
  local_c8.m_col = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)&local_c8,8,2,4);
  pMVar1 = (Matrix<double,__1,__1,_0,__1,__1> *)
           (this->H_laser_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data;
  (this->H_laser_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = (double *)local_c8.m_xpr;
  DVar2 = (this->H_laser_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_rows;
  DVar3 = (this->H_laser_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols;
  (this->H_laser_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = local_c8.m_row;
  (this->H_laser_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
       = local_c8.m_col;
  local_c8.m_xpr = pMVar1;
  local_c8.m_row = DVar2;
  local_c8.m_col = DVar3;
  free(pMVar1);
  local_c8.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)0x0;
  local_c8.m_row = 0;
  local_c8.m_col = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)&local_c8,0xc,3,4);
  pMVar1 = (Matrix<double,__1,__1,_0,__1,__1> *)
           (this->Hj_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data;
  (this->Hj_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)local_c8.m_xpr;
  DVar2 = (this->Hj_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows;
  DVar3 = (this->Hj_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols;
  (this->Hj_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       local_c8.m_row;
  (this->Hj_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       local_c8.m_col;
  local_c8.m_xpr = pMVar1;
  local_c8.m_row = DVar2;
  local_c8.m_col = DVar3;
  free(pMVar1);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&local_c8,4,4,1);
  pMVar1 = (Matrix<double,__1,__1,_0,__1,__1> *)
           (this->ekf_).x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  (this->ekf_).x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)local_c8.m_xpr;
  DVar2 = (this->ekf_).x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  (this->ekf_).x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       local_c8.m_row;
  local_c8.m_xpr = pMVar1;
  local_c8.m_row = DVar2;
  free(pMVar1);
  local_c8.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)0x0;
  local_c8.m_row = 0;
  local_c8.m_col = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)&local_c8,0x10,4,4);
  pMVar1 = (Matrix<double,__1,__1,_0,__1,__1> *)
           (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data;
  (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = (double *)local_c8.m_xpr;
  DVar2 = (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_rows;
  DVar3 = (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_cols;
  (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = local_c8.m_row;
  (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
       = local_c8.m_col;
  local_c8.m_xpr = pMVar1;
  local_c8.m_row = DVar2;
  local_c8.m_col = DVar3;
  free(pMVar1);
  local_c8.m_row = 0;
  local_c8.m_col = 1;
  local_c8.m_currentBlockRows = 1;
  *(this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = 1.0;
  local_98 = 0.0;
  local_c8.m_xpr = &(this->ekf_).P_;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (&local_c8,&local_98);
  local_a0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_a0);
  local_a8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_a8);
  local_78 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_78);
  local_80 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_80);
  local_88 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_88);
  local_90 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_90);
  local_70 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_70);
  local_38 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_38);
  local_40 = 1000.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_40);
  local_48 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_48);
  local_50 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_50);
  local_58 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_58);
  local_60 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_60);
  local_68 = 1000.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar4,&local_68);
  lVar5 = ((local_c8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
          m_storage.m_cols;
  if (local_c8.m_currentBlockRows + local_c8.m_row !=
      ((local_c8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
      .m_rows) {
    if (lVar5 != 0) goto LAB_00103e65;
    lVar5 = 0;
  }
  if (local_c8.m_col == lVar5) {
    local_c8.m_xpr = &this->R_laser_;
    local_c8.m_row = 0;
    local_c8.m_col = 1;
    local_c8.m_currentBlockRows = 1;
    *((local_c8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
     m_data = 0.0225;
    local_98 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (&local_c8,&local_98);
    local_a0 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_a0);
    local_a8 = 0.0225;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar4,&local_a8);
    lVar5 = ((local_c8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
            m_storage.m_cols;
    if (local_c8.m_currentBlockRows + local_c8.m_row !=
        ((local_c8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
        m_storage.m_rows) {
      if (lVar5 != 0) goto LAB_00103e65;
      lVar5 = 0;
    }
    if (local_c8.m_col == lVar5) {
      local_c8.m_xpr = &this->R_radar_;
      local_c8.m_row = 0;
      local_c8.m_col = 1;
      local_c8.m_currentBlockRows = 1;
      *((local_c8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
       m_storage.m_data = 0.09;
      local_98 = 0.0;
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (&local_c8,&local_98);
      local_a0 = 0.0;
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar4,&local_a0);
      local_a8 = 0.0;
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar4,&local_a8);
      local_78 = 9e-05;
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar4,&local_78);
      local_80 = 0.0;
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar4,&local_80);
      local_88 = 0.0;
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar4,&local_88);
      local_90 = 0.0;
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar4,&local_90);
      local_70 = 0.09;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                (pCVar4,&local_70);
      lVar5 = ((local_c8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
              m_storage.m_cols;
      if (local_c8.m_currentBlockRows + local_c8.m_row !=
          ((local_c8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
          m_storage.m_rows) {
        if (lVar5 != 0) goto LAB_00103e65;
        lVar5 = 0;
      }
      if (local_c8.m_col == lVar5) {
        local_c8.m_xpr = &this->H_laser_;
        local_c8.m_row = 0;
        local_c8.m_col = 1;
        local_c8.m_currentBlockRows = 1;
        *((local_c8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
         m_storage.m_data = 1.0;
        local_98 = 0.0;
        pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                           (&local_c8,&local_98);
        local_a0 = 0.0;
        pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                           (pCVar4,&local_a0);
        local_a8 = 0.0;
        pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                           (pCVar4,&local_a8);
        local_78 = 0.0;
        pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                           (pCVar4,&local_78);
        local_80 = 1.0;
        pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                           (pCVar4,&local_80);
        local_88 = 0.0;
        pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                           (pCVar4,&local_88);
        local_90 = 0.0;
        Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                  (pCVar4,&local_90);
        lVar5 = ((local_c8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
                .m_storage.m_cols;
        if (local_c8.m_currentBlockRows + local_c8.m_row !=
            ((local_c8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
            m_storage.m_rows) {
          if (lVar5 != 0) goto LAB_00103e65;
          lVar5 = 0;
        }
        if (local_c8.m_col == lVar5) {
          local_c8.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)0x0;
          local_c8.m_row = 0;
          local_c8.m_col = 0;
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                    ((DenseStorage<double,__1,__1,__1,_0> *)&local_c8,0x10,4,4);
          pMVar1 = (Matrix<double,__1,__1,_0,__1,__1> *)
                   (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data;
          (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_data = (double *)local_c8.m_xpr;
          DVar2 = (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows;
          DVar3 = (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_cols;
          (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_rows = local_c8.m_row;
          (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_cols = local_c8.m_col;
          local_c8.m_xpr = pMVar1;
          local_c8.m_row = DVar2;
          local_c8.m_col = DVar3;
          free(pMVar1);
          local_c8.m_row = 0;
          local_c8.m_col = 1;
          local_c8.m_currentBlockRows = 1;
          *(this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data = 1.0;
          local_98 = 0.0;
          local_c8.m_xpr = &(this->ekf_).F_;
          pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                             (&local_c8,&local_98);
          local_a0 = 1.0;
          pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                             (pCVar4,&local_a0);
          local_a8 = 0.0;
          pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                             (pCVar4,&local_a8);
          local_78 = 0.0;
          pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                             (pCVar4,&local_78);
          local_80 = 1.0;
          pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                             (pCVar4,&local_80);
          local_88 = 0.0;
          pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                             (pCVar4,&local_88);
          local_90 = 1.0;
          pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                             (pCVar4,&local_90);
          local_70 = 0.0;
          pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                             (pCVar4,&local_70);
          local_38 = 0.0;
          pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                             (pCVar4,&local_38);
          local_40 = 1.0;
          pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                             (pCVar4,&local_40);
          local_48 = 0.0;
          pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                             (pCVar4,&local_48);
          local_50 = 0.0;
          pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                             (pCVar4,&local_50);
          local_58 = 0.0;
          pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                             (pCVar4,&local_58);
          local_60 = 0.0;
          pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                             (pCVar4,&local_60);
          local_68 = 1.0;
          Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                    (pCVar4,&local_68);
          lVar5 = ((local_c8.m_xpr)->
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
          ;
          if (local_c8.m_currentBlockRows + local_c8.m_row !=
              ((local_c8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
              m_storage.m_rows) {
            if (lVar5 != 0) goto LAB_00103e65;
            lVar5 = 0;
          }
          if (local_c8.m_col == lVar5) {
            this->noise_ax = 9.0;
            this->noise_ay = 9.0;
            Tools::Tools((Tools *)&local_c8);
            Tools::~Tools((Tools *)&local_c8);
            return;
          }
        }
      }
    }
  }
LAB_00103e65:
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ckirksey3[P]extended-kalman-filter-cpp/src/Eigen/src/Core/CommaInitializer.h"
                ,0x6f,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::finished() [MatrixType = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

FusionEKF::FusionEKF() {
  is_initialized_ = false;

  previous_timestamp_ = 0;

  // initializing matrices
  R_laser_ = MatrixXd(2, 2);
  R_radar_ = MatrixXd(3, 3);
  H_laser_ = MatrixXd(2, 4);
  Hj_ = MatrixXd(3, 4);

  //create a 4D state vector, we don't know yet the values of the x state
  ekf_.x_ = VectorXd(4);

  //state covariance matrix P
  ekf_.P_ = MatrixXd(4, 4);
  ekf_.P_ << 1, 0, 0, 0,
              0, 1, 0, 0,
              0, 0, 1000, 0,
              0, 0, 0, 1000;

  //laser measurement covariance
  R_laser_ << 0.0225, 0,
              0, 0.0225;

  //radar measurement covariance
  R_radar_ << 0.09, 0, 0,
              0, 0.00009, 0,
              0, 0, 0.09;

  //laser measurement matrix
  H_laser_ << 1, 0, 0, 0,
              0, 1, 0, 0;

  //the initial transition matrix F_
  ekf_.F_ = MatrixXd(4, 4);
  ekf_.F_ << 1, 0, 1, 0,
              0, 1, 0, 1,
              0, 0, 1, 0,
              0, 0, 0, 1;

  //set the acceleration noise components
  noise_ax = 9;
  noise_ay = 9;

  tools = Tools();
}